

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_set_key_domain_parameters
          (psa_key_attributes_t *attributes,psa_key_type_t type,uint8_t *data,size_t data_length)

{
  void *local_38;
  uint8_t *copy;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_type_t type_local;
  psa_key_attributes_t *attributes_local;
  
  local_38 = (void *)0x0;
  if (data_length != 0) {
    local_38 = calloc(1,data_length);
    if (local_38 == (void *)0x0) {
      return -0x8d;
    }
    memcpy(local_38,data,data_length);
  }
  if (attributes->domain_parameters != (void *)0x0) {
    free(attributes->domain_parameters);
    attributes->domain_parameters = (void *)0x0;
    attributes->domain_parameters_size = 0;
  }
  attributes->domain_parameters = local_38;
  attributes->domain_parameters_size = data_length;
  (attributes->core).type = type;
  return 0;
}

Assistant:

psa_status_t psa_set_key_domain_parameters( psa_key_attributes_t *attributes,
                                            psa_key_type_t type,
                                            const uint8_t *data,
                                            size_t data_length )
{
    uint8_t *copy = NULL;

    if( data_length != 0 )
    {
        copy = mbedtls_calloc( 1, data_length );
        if( copy == NULL )
            return( PSA_ERROR_INSUFFICIENT_MEMORY );
        memcpy( copy, data, data_length );
    }
    /* After this point, this function is guaranteed to succeed, so it
     * can start modifying `*attributes`. */

    if( attributes->domain_parameters != NULL )
    {
        mbedtls_free( attributes->domain_parameters );
        attributes->domain_parameters = NULL;
        attributes->domain_parameters_size = 0;
    }

    attributes->domain_parameters = copy;
    attributes->domain_parameters_size = data_length;
    attributes->core.type = type;
    return( PSA_SUCCESS );
}